

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int handle_server_handshake_message
              (ptls_t *tls,ptls_message_emitter_t *emitter,ptls_iovec_t message,int is_end_of_record
              ,ptls_handshake_properties_t *properties)

{
  byte bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  ptls_log_conn_state_t *conn;
  int local_5c;
  int ptlslog_include_appdata;
  ptls_log_conn_state_t *conn_state;
  ptls_t *_tls;
  int32_t local_40;
  uint32_t active;
  int ret;
  uint8_t type;
  ptls_handshake_properties_t *properties_local;
  int is_end_of_record_local;
  ptls_message_emitter_t *emitter_local;
  ptls_t *tls_local;
  ptls_iovec_t message_local;
  
  bVar1 = *message.base;
  switch(tls->state) {
  case PTLS_STATE_SERVER_EXPECT_CLIENT_HELLO:
  case PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO:
    if ((bVar1 == 1) && (is_end_of_record != 0)) {
      local_40 = server_handle_hello(tls,emitter,message,properties);
    }
    else {
      local_40 = 0x28;
    }
    break;
  default:
    __assert_fail("!\"unexpected state\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c",
                  0x167b,
                  "int handle_server_handshake_message(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, int, ptls_handshake_properties_t *)"
                 );
  case PTLS_STATE_SERVER_EXPECT_CERTIFICATE:
    if (bVar1 == 0xb) {
      local_40 = server_handle_certificate(tls,message);
    }
    else {
      local_40 = 10;
    }
    break;
  case PTLS_STATE_SERVER_EXPECT_CERTIFICATE_VERIFY:
    if (bVar1 == 0xf) {
      local_40 = server_handle_certificate_verify(tls,message);
    }
    else {
      local_40 = 10;
    }
    break;
  case PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA:
    if (((byte)tls->ctx->field_0xb8 >> 4 & 1) != 0) {
      __assert_fail("!tls->ctx->omit_end_of_early_data",
                    "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c",
                    0x1662,
                    "int handle_server_handshake_message(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, int, ptls_handshake_properties_t *)"
                   );
    }
    if (bVar1 == 5) {
      local_40 = server_handle_end_of_early_data(tls,message);
    }
    else {
      local_40 = 10;
    }
    break;
  case PTLS_STATE_SERVER_EXPECT_FINISHED:
    if ((bVar1 == 0x14) && (is_end_of_record != 0)) {
      local_40 = server_handle_finished(tls,message);
    }
    else {
      local_40 = 0x28;
    }
    break;
  case PTLS_STATE_SERVER_POST_HANDSHAKE:
    if (bVar1 == 0x18) {
      local_40 = handle_key_update(tls,emitter,message);
    }
    else {
      local_40 = 10;
    }
  }
  uVar2 = ptls_log_point_maybe_active(&handle_server_handshake_message::logpoint);
  if (uVar2 != 0) {
    conn = ptls_get_log_state(tls);
    uVar3 = ptls_log_conn_maybe_active(conn,ptls_get_server_name,tls);
    if ((uVar3 & uVar2) != 0) {
      local_5c = 0;
      do {
        ptls_log__do_write_start(&handle_server_handshake_message::logpoint,1);
        ptls_log__do_push_element_unsigned64(",\"tls\":",7,(uint64_t)tls);
        ptls_log__do_push_element_unsigned32(",\"message\":",0xb,(uint)*message.base);
        ptls_log__do_push_element_unsigned64(",\"len\":",7,message.len - 4);
        ptls_log__do_push_element_signed32(",\"result\":",10,local_40);
        local_5c = ptls_log__do_write_end
                             (&handle_server_handshake_message::logpoint,conn,ptls_get_server_name,
                              tls,local_5c);
      } while (local_5c != 0);
    }
  }
  return local_40;
}

Assistant:

static int handle_server_handshake_message(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_iovec_t message, int is_end_of_record,
                                           ptls_handshake_properties_t *properties)
{
    uint8_t type = message.base[0];
    int ret;

    switch (tls->state) {
    case PTLS_STATE_SERVER_EXPECT_CLIENT_HELLO:
    case PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO:
        if (type == PTLS_HANDSHAKE_TYPE_CLIENT_HELLO && is_end_of_record) {
            ret = server_handle_hello(tls, emitter, message, properties);
        } else {
            ret = PTLS_ALERT_HANDSHAKE_FAILURE;
        }
        break;
    case PTLS_STATE_SERVER_EXPECT_CERTIFICATE:
        if (type == PTLS_HANDSHAKE_TYPE_CERTIFICATE) {
            ret = server_handle_certificate(tls, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_SERVER_EXPECT_CERTIFICATE_VERIFY:
        if (type == PTLS_HANDSHAKE_TYPE_CERTIFICATE_VERIFY) {
            ret = server_handle_certificate_verify(tls, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA:
        assert(!tls->ctx->omit_end_of_early_data);
        if (type == PTLS_HANDSHAKE_TYPE_END_OF_EARLY_DATA) {
            ret = server_handle_end_of_early_data(tls, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_SERVER_EXPECT_FINISHED:
        if (type == PTLS_HANDSHAKE_TYPE_FINISHED && is_end_of_record) {
            ret = server_handle_finished(tls, message);
        } else {
            ret = PTLS_ALERT_HANDSHAKE_FAILURE;
        }
        break;
    case PTLS_STATE_SERVER_POST_HANDSHAKE:
        switch (type) {
        case PTLS_HANDSHAKE_TYPE_KEY_UPDATE:
            ret = handle_key_update(tls, emitter, message);
            break;
        default:
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            break;
        }
        break;
    default:
        assert(!"unexpected state");
        ret = PTLS_ALERT_INTERNAL_ERROR;
        break;
    }

    PTLS_PROBE(RECEIVE_MESSAGE, tls, message.base[0], message.base + PTLS_HANDSHAKE_HEADER_SIZE,
               message.len - PTLS_HANDSHAKE_HEADER_SIZE, ret);
    PTLS_LOG_CONN(receive_message, tls, {
        PTLS_LOG_ELEMENT_UNSIGNED(message, message.base[0]);
        PTLS_LOG_ELEMENT_UNSIGNED(len, message.len - PTLS_HANDSHAKE_HEADER_SIZE);
        PTLS_LOG_ELEMENT_SIGNED(result, ret);
    });

    return ret;
}